

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BitvecTestNotNull(Bitvec *p,u32 i)

{
  uint uVar1;
  int iVar2;
  uint local_24;
  u32 h;
  u32 bin;
  u32 i_local;
  Bitvec *p_local;
  
  h = i - 1;
  _bin = p;
  if (h < p->iSize) {
    do {
      if (_bin->iDivisor == 0) {
        if (_bin->iSize < 0xf81) {
          return (uint)(((uint)(_bin->u).aBitmap[h >> 3] & 1 << ((byte)h & 7)) != 0);
        }
        iVar2 = h + 1;
        while( true ) {
          local_24 = h % 0x7c;
          if (*(int *)((long)&_bin->u + (ulong)local_24 * 4) == 0) {
            return 0;
          }
          if (*(int *)((long)&_bin->u + (ulong)local_24 * 4) == iVar2) break;
          h = local_24 + 1;
        }
        return 1;
      }
      uVar1 = h / _bin->iDivisor;
      h = h % _bin->iDivisor;
      _bin = *(Bitvec **)((long)&_bin->u + (ulong)uVar1 * 8);
    } while (_bin != (Bitvec *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecTestNotNull(Bitvec *p, u32 i){
  assert( p!=0 );
  i--;
  if( i>=p->iSize ) return 0;
  while( p->iDivisor ){
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    p = p->u.apSub[bin];
    if (!p) {
      return 0;
    }
  }
  if( p->iSize<=BITVEC_NBIT ){
    return (p->u.aBitmap[i/BITVEC_SZELEM] & (1<<(i&(BITVEC_SZELEM-1))))!=0;
  } else{
    u32 h = BITVEC_HASH(i++);
    while( p->u.aHash[h] ){
      if( p->u.aHash[h]==i ) return 1;
      h = (h+1) % BITVEC_NINT;
    }
    return 0;
  }
}